

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

FilteredOutputGroups *
wallet::GroupOutputs
          (FilteredOutputGroups *__return_storage_ptr__,CWallet *wallet,CoinsResult *coins,
          CoinSelectionParams *coin_sel_params,
          vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *filters,
          vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *ret_discarded_groups)

{
  COutput *pCVar1;
  Chain *pCVar2;
  pointer pSVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  mapped_type *this;
  _Rb_tree_node_base *p_Var6;
  bool bVar7;
  COutput *pCVar8;
  _Rb_tree_header *p_Var9;
  pointer eligibility_filter;
  long in_FS_OFFSET;
  vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *__range4;
  size_t ancestors_1;
  size_t descendants;
  size_t ancestors;
  size_t descendants_1;
  ScriptPubKeyToOutgroup spk_to_positive_groups_map;
  ScriptPubKeyToOutgroup spk_to_groups_map;
  anon_class_24_3_ac95488a local_110;
  size_t local_f8;
  size_t local_f0;
  anon_class_8_1_35acf559 local_e8;
  undefined1 local_d9;
  _Rb_tree<std::pair<CScript,_OutputType>,_std::pair<const_std::pair<CScript,_OutputType>,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>,_std::_Select1st<std::pair<const_std::pair<CScript,_OutputType>,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>_>,_std::less<std::pair<CScript,_OutputType>_>,_std::allocator<std::pair<const_std::pair<CScript,_OutputType>,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>_>_>
  local_d8;
  undefined1 local_a8 [16];
  _Base_ptr local_98;
  _Base_ptr local_90;
  _Base_ptr local_88;
  size_t local_80;
  size_t local_78;
  size_t sStack_70;
  CAmount local_68;
  CAmount CStack_60;
  CAmount local_58;
  CFeeRate local_50;
  bool local_48;
  int local_44;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var9 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var9->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var9->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (coin_sel_params->m_avoid_partial_spends == false) {
    p_Var6 = (coins->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var9 = &(coins->coins)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 != p_Var9) {
      do {
        pCVar1 = (COutput *)p_Var6[1]._M_left;
        for (pCVar8 = (COutput *)p_Var6[1]._M_parent; pCVar8 != pCVar1; pCVar8 = pCVar8 + 1) {
          pCVar2 = wallet->m_chain;
          if (pCVar2 == (Chain *)0x0) goto LAB_0023b24b;
          (**(code **)(*(long *)pCVar2 + 0xb0))(pCVar2,&pCVar8->outpoint,&local_110,&local_e8,0,0);
          local_a8._0_8_ = (pointer)0x0;
          local_a8._8_8_ = (pointer)0x0;
          local_98 = (_Base_ptr)0x0;
          local_90 = (_Base_ptr)CONCAT71(local_90._1_7_,1);
          local_88 = (_Base_ptr)0x0;
          local_80 = CONCAT44(local_80._4_4_,999);
          local_58 = 0;
          local_68 = 0;
          CStack_60 = 0;
          local_78 = 0;
          sStack_70 = 0;
          local_50.nSatoshisPerK = (coin_sel_params->m_long_term_feerate).nSatoshisPerK;
          local_48 = coin_sel_params->m_subtract_fee_outputs;
          local_44 = 0;
          local_d8._M_impl._0_8_ = 0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<wallet::COutput,std::allocator<wallet::COutput>,wallet::COutput_const&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_d8._M_impl.super__Rb_tree_header,(COutput **)&local_d8,
                     (allocator<wallet::COutput> *)&local_f0,pCVar8);
          OutputGroup::Insert((OutputGroup *)local_a8,(shared_ptr<wallet::COutput> *)&local_d8,
                              (size_t)local_110.filters,(size_t)local_e8.coin_sel_params);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_d8._M_impl.super__Rb_tree_header._M_header._4_4_,
                       local_d8._M_impl.super__Rb_tree_header._M_header._M_color) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(local_d8._M_impl.super__Rb_tree_header._M_header._4_4_,
                                local_d8._M_impl.super__Rb_tree_header._M_header._M_color));
          }
          eligibility_filter =
               (filters->
               super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
               )._M_impl.super__Vector_impl_data._M_start;
          pSVar3 = (filters->
                   super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (eligibility_filter == pSVar3) {
LAB_0023b1da:
            std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>::
            emplace_back<wallet::OutputGroup&>
                      ((vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>> *)
                       ret_discarded_groups,(OutputGroup *)local_a8);
          }
          else {
            bVar7 = false;
            do {
              while (bVar4 = OutputGroup::EligibleForSpending
                                       ((OutputGroup *)local_a8,&eligibility_filter->filter), bVar4)
              {
                this = std::
                       map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
                       ::operator[](__return_storage_ptr__,&eligibility_filter->filter);
                OutputGroupTypeMap::Push(this,(OutputGroup *)local_a8,p_Var6[1]._M_color,true,true);
                eligibility_filter = eligibility_filter + 1;
                bVar7 = true;
                if (eligibility_filter == pSVar3) goto LAB_0023b1e7;
              }
              eligibility_filter = eligibility_filter + 1;
            } while (eligibility_filter != pSVar3);
            if (!bVar7) goto LAB_0023b1da;
          }
LAB_0023b1e7:
          std::
          vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::~vector((vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                     *)local_a8);
        }
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var9);
    }
  }
  else {
    local_90 = (_Base_ptr)(local_a8 + 8);
    local_a8._8_8_ = local_a8._8_8_ & 0xffffffff00000000;
    local_98 = (_Base_ptr)0x0;
    local_80 = 0;
    local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_d8._M_impl.super__Rb_tree_header._M_header;
    local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var5 = (coins->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var9 = &(coins->coins)._M_t._M_impl.super__Rb_tree_header;
    local_e8.coin_sel_params = coin_sel_params;
    local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
    local_88 = local_90;
    if ((_Rb_tree_header *)p_Var5 != p_Var9) {
      do {
        pCVar1 = (COutput *)p_Var5[1]._M_left;
        for (pCVar8 = (COutput *)p_Var5[1]._M_parent; pCVar8 != pCVar1; pCVar8 = pCVar8 + 1) {
          pCVar2 = wallet->m_chain;
          if (pCVar2 == (Chain *)0x0) {
LAB_0023b24b:
            __assert_fail("m_chain",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                          ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
          }
          (**(code **)(*(long *)pCVar2 + 0xb0))(pCVar2,&pCVar8->outpoint,&local_f0,&local_f8,0,0);
          local_110.filters =
               (vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<wallet::COutput,std::allocator<wallet::COutput>,wallet::COutput_const&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_110.filtered_groups,
                     (COutput **)&local_110,(allocator<wallet::COutput> *)&local_d9,pCVar8);
          if ((pCVar8->effective_value).super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_engaged == false) {
            __assert_fail("effective_value.has_value()",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.h"
                          ,0x82,"CAmount wallet::COutput::GetEffectiveValue() const");
          }
          if (0 < (pCVar8->effective_value).super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._M_payload._M_value) {
            GroupOutputs::anon_class_8_1_35acf559::operator()
                      (&local_e8,(shared_ptr<wallet::COutput> *)&local_110,p_Var5[1]._M_color,
                       local_f0,local_f8,(ScriptPubKeyToOutgroup *)&local_d8);
          }
          GroupOutputs::anon_class_8_1_35acf559::operator()
                    (&local_e8,(shared_ptr<wallet::COutput> *)&local_110,p_Var5[1]._M_color,local_f0
                     ,local_f8,(ScriptPubKeyToOutgroup *)local_a8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110.filtered_groups !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110.filtered_groups);
          }
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var9);
    }
    local_110.filters = filters;
    local_110.filtered_groups = __return_storage_ptr__;
    local_110.ret_discarded_groups = ret_discarded_groups;
    GroupOutputs::anon_class_24_3_ac95488a::operator()
              (&local_110,(ScriptPubKeyToOutgroup *)local_a8,false);
    GroupOutputs::anon_class_24_3_ac95488a::operator()
              (&local_110,(ScriptPubKeyToOutgroup *)&local_d8,true);
    std::
    _Rb_tree<std::pair<CScript,_OutputType>,_std::pair<const_std::pair<CScript,_OutputType>,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>,_std::_Select1st<std::pair<const_std::pair<CScript,_OutputType>,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>_>,_std::less<std::pair<CScript,_OutputType>_>,_std::allocator<std::pair<const_std::pair<CScript,_OutputType>,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>_>_>
    ::~_Rb_tree(&local_d8);
    std::
    _Rb_tree<std::pair<CScript,_OutputType>,_std::pair<const_std::pair<CScript,_OutputType>,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>,_std::_Select1st<std::pair<const_std::pair<CScript,_OutputType>,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>_>,_std::less<std::pair<CScript,_OutputType>_>,_std::allocator<std::pair<const_std::pair<CScript,_OutputType>,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::pair<CScript,_OutputType>,_std::pair<const_std::pair<CScript,_OutputType>,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>,_std::_Select1st<std::pair<const_std::pair<CScript,_OutputType>,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>_>,_std::less<std::pair<CScript,_OutputType>_>,_std::allocator<std::pair<const_std::pair<CScript,_OutputType>,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>_>_>
                 *)local_a8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

FilteredOutputGroups GroupOutputs(const CWallet& wallet,
                          const CoinsResult& coins,
                          const CoinSelectionParams& coin_sel_params,
                          const std::vector<SelectionFilter>& filters,
                          std::vector<OutputGroup>& ret_discarded_groups)
{
    FilteredOutputGroups filtered_groups;

    if (!coin_sel_params.m_avoid_partial_spends) {
        // Allowing partial spends means no grouping. Each COutput gets its own OutputGroup
        for (const auto& [type, outputs] : coins.coins) {
            for (const COutput& output : outputs) {
                // Get mempool info
                size_t ancestors, descendants;
                wallet.chain().getTransactionAncestry(output.outpoint.hash, ancestors, descendants);

                // Create a new group per output and add it to the all groups vector
                OutputGroup group(coin_sel_params);
                group.Insert(std::make_shared<COutput>(output), ancestors, descendants);

                // Each filter maps to a different set of groups
                bool accepted = false;
                for (const auto& sel_filter : filters) {
                    const auto& filter = sel_filter.filter;
                    if (!group.EligibleForSpending(filter)) continue;
                    filtered_groups[filter].Push(group, type, /*insert_positive=*/true, /*insert_mixed=*/true);
                    accepted = true;
                }
                if (!accepted) ret_discarded_groups.emplace_back(group);
            }
        }
        return filtered_groups;
    }

    // We want to combine COutputs that have the same scriptPubKey into single OutputGroups
    // except when there are more than OUTPUT_GROUP_MAX_ENTRIES COutputs grouped in an OutputGroup.
    // To do this, we maintain a map where the key is the scriptPubKey and the value is a vector of OutputGroups.
    // For each COutput, we check if the scriptPubKey is in the map, and if it is, the COutput is added
    // to the last OutputGroup in the vector for the scriptPubKey. When the last OutputGroup has
    // OUTPUT_GROUP_MAX_ENTRIES COutputs, a new OutputGroup is added to the end of the vector.
    typedef std::map<std::pair<CScript, OutputType>, std::vector<OutputGroup>> ScriptPubKeyToOutgroup;
    const auto& insert_output = [&](
            const std::shared_ptr<COutput>& output, OutputType type, size_t ancestors, size_t descendants,
            ScriptPubKeyToOutgroup& groups_map) {
        std::vector<OutputGroup>& groups = groups_map[std::make_pair(output->txout.scriptPubKey,type)];

        if (groups.size() == 0) {
            // No OutputGroups for this scriptPubKey yet, add one
            groups.emplace_back(coin_sel_params);
        }

        // Get the last OutputGroup in the vector so that we can add the COutput to it
        // A pointer is used here so that group can be reassigned later if it is full.
        OutputGroup* group = &groups.back();

        // Check if this OutputGroup is full. We limit to OUTPUT_GROUP_MAX_ENTRIES when using -avoidpartialspends
        // to avoid surprising users with very high fees.
        if (group->m_outputs.size() >= OUTPUT_GROUP_MAX_ENTRIES) {
            // The last output group is full, add a new group to the vector and use that group for the insertion
            groups.emplace_back(coin_sel_params);
            group = &groups.back();
        }

        group->Insert(output, ancestors, descendants);
    };

    ScriptPubKeyToOutgroup spk_to_groups_map;
    ScriptPubKeyToOutgroup spk_to_positive_groups_map;
    for (const auto& [type, outs] : coins.coins) {
        for (const COutput& output : outs) {
            size_t ancestors, descendants;
            wallet.chain().getTransactionAncestry(output.outpoint.hash, ancestors, descendants);

            const auto& shared_output = std::make_shared<COutput>(output);
            // Filter for positive only before adding the output
            if (output.GetEffectiveValue() > 0) {
                insert_output(shared_output, type, ancestors, descendants, spk_to_positive_groups_map);
            }

            // 'All' groups
            insert_output(shared_output, type, ancestors, descendants, spk_to_groups_map);
        }
    }

    // Now we go through the entire maps and pull out the OutputGroups
    const auto& push_output_groups = [&](const ScriptPubKeyToOutgroup& groups_map, bool positive_only) {
        for (const auto& [script, groups] : groups_map) {
            // Go through the vector backwards. This allows for the first item we deal with being the partial group.
            for (auto group_it = groups.rbegin(); group_it != groups.rend(); group_it++) {
                const OutputGroup& group = *group_it;

                // Each filter maps to a different set of groups
                bool accepted = false;
                for (const auto& sel_filter : filters) {
                    const auto& filter = sel_filter.filter;
                    if (!group.EligibleForSpending(filter)) continue;

                    // Don't include partial groups if there are full groups too and we don't want partial groups
                    if (group_it == groups.rbegin() && groups.size() > 1 && !filter.m_include_partial_groups) {
                        continue;
                    }

                    OutputType type = script.second;
                    // Either insert the group into the positive-only groups or the mixed ones.
                    filtered_groups[filter].Push(group, type, positive_only, /*insert_mixed=*/!positive_only);
                    accepted = true;
                }
                if (!accepted) ret_discarded_groups.emplace_back(group);
            }
        }
    };

    push_output_groups(spk_to_groups_map, /*positive_only=*/ false);
    push_output_groups(spk_to_positive_groups_map, /*positive_only=*/ true);

    return filtered_groups;
}